

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_string.c
# Opt level: O1

void * memmem(void *__haystack,size_t __haystacklen,void *__needle,size_t __needlelen)

{
  char *__dest;
  char *__dest_00;
  char *pcVar1;
  char *pcVar2;
  
  __dest = (char *)calloc(__haystacklen + 1,1);
  if (__dest == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    __dest_00 = (char *)calloc(__needlelen + 1,1);
    if (__dest_00 == (char *)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      strncpy(__dest,(char *)__haystack,__haystacklen);
      strncpy(__dest_00,(char *)__needle,__needlelen);
      pcVar1 = strstr(__dest,__dest_00);
      pcVar2 = __dest + (long)__haystack + -(long)pcVar1;
      if (pcVar1 == (char *)0x0) {
        pcVar2 = (char *)0x0;
      }
      free(__dest_00);
    }
    free(__dest);
  }
  return pcVar2;
}

Assistant:

void *memmem(const void *haystack, size_t haystacklen,
             const void *needle, size_t needlelen)
{
    char *null_terminated_haystack_buffer;
    char *null_terminated_needle_buffer;
    void *result;

    result = NULL;

    null_terminated_haystack_buffer = (char *) calloc(haystacklen + 1,
                                                      sizeof(char));

    if(NULL != null_terminated_haystack_buffer){
        null_terminated_needle_buffer = (char *) calloc(needlelen + 1,
                                                        sizeof(char));

        if(NULL != null_terminated_needle_buffer){
            strncpy(null_terminated_haystack_buffer, haystack, haystacklen);
            strncpy(null_terminated_needle_buffer, needle, needlelen);

            result = strstr(null_terminated_haystack_buffer, 
                            null_terminated_needle_buffer);

            if (result != NULL) {
                result = (void *)
                    ((((uintptr_t) null_terminated_haystack_buffer) - \
                      ((uintptr_t) result)) +
                     ((uintptr_t) haystack));
            }

            free(null_terminated_needle_buffer);
        }

        free(null_terminated_haystack_buffer);
    }

    return result;
}